

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void cfgfile::write_cfgfile<cfgfile::qstring_trait_t>
               (tag_t<cfgfile::qstring_trait_t> *tag,ostream_t *stream,file_format_t fmt)

{
  int in_EDX;
  QTextStream *in_RSI;
  long *in_RDI;
  QDomDocument doc;
  string_t content;
  qstring_wrapper_t *in_stack_ffffffffffffff78;
  QTextStream *in_stack_ffffffffffffff80;
  QString local_60;
  QDomDocument local_48 [24];
  undefined1 local_30 [32];
  QTextStream *local_10;
  long *local_8;
  
  if (in_EDX == 0) {
    (**(code **)(*in_RDI + 0x18))(local_30,in_RDI,0);
    operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x106fcc);
  }
  else if (in_EDX == 1) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    QDomDocument::QDomDocument(local_48);
    (**(code **)(*local_8 + 0x20))(local_8,local_48,0);
    QDomDocument::toString((int)&local_60);
    QTextStream::operator<<(local_10,&local_60);
    QString::~QString((QString *)0x107054);
    QDomDocument::~QDomDocument(local_48);
  }
  return;
}

Assistant:

static inline void write_cfgfile(
	//! Configuration tag.
	const tag_t< Trait > & tag,
	//! Stream.
	typename Trait::ostream_t & stream,
	//! Format of the file.
	file_format_t fmt = file_format_t::cfgfile_format )
{
	switch( fmt )
	{
		case file_format_t::cfgfile_format :
		{
			const typename Trait::string_t content = tag.print();

			stream << content;
		}
			break;

		case file_format_t::xml_format :
		{
#ifdef CFGFILE_QT_SUPPORT
#ifdef CFGFILE_XML_SUPPORT
			QDomDocument doc;

			tag.print( doc );

			stream << doc.toString( 4 );
#else
			throw exception_t< Trait >(
				Trait::from_ascii( "To use XML format build cfgfile "
					"with CFGFILE_XML_SUPPORT" ) );
#endif // CFGFILE_XML_SUPPORT
#else
			throw exception_t< Trait >(
				Trait::from_ascii( "XML supported only with Qt." ) );
#endif // CFGFILE_QT_SUPPORT
		}
			break;
	}
}